

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O2

void check_reset_rc_flag(AV1_COMP *cpi)

{
  uint uVar1;
  AV1_PRIMARY *pAVar2;
  int64_t iVar3;
  LAYER_CONTEXT *pLVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  
  if ((uint)(cpi->svc).number_spatial_layers < (cpi->common).current_frame.frame_number) {
    pAVar2 = cpi->ppi;
    if (pAVar2->use_svc != 0) {
      iVar10 = (cpi->svc).number_spatial_layers;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      for (iVar11 = 0; iVar11 != iVar10; iVar11 = iVar11 + 1) {
        uVar1 = (cpi->svc).number_temporal_layers;
        iVar9 = uVar1 * iVar11;
        iVar6 = uVar1 + iVar9 + -1;
        pLVar4 = (cpi->svc).layer_context;
        iVar7 = pLVar4[iVar6].rc.avg_frame_bandwidth;
        iVar6 = pLVar4[iVar6].rc.prev_avg_frame_bandwidth;
        if (iVar6 == 0 || iVar7 == 0) {
          iVar7 = pLVar4[iVar9].rc.avg_frame_bandwidth;
          iVar6 = pLVar4[iVar9].rc.prev_avg_frame_bandwidth;
        }
        if ((iVar6 >> 1 < iVar7 / 3) || (iVar7 < iVar6 >> 1)) {
          uVar12 = (ulong)uVar1;
          if ((int)uVar1 < 1) {
            uVar12 = 0;
          }
          for (lVar8 = 0; uVar12 * 0x3380 - lVar8 != 0; lVar8 = lVar8 + 0x3380) {
            *(undefined8 *)
             ((long)pLVar4[iVar9].rc.frame_level_rate_correction_factors + lVar8 + -0x44) = 0;
            uVar5 = *(undefined8 *)((long)pLVar4[iVar9].p_rc.avg_frame_qindex + lVar8 + -0x44);
            *(undefined8 *)((long)pLVar4[iVar9].p_rc.q_history + lVar8 + -0x10) = uVar5;
            *(undefined8 *)((long)pLVar4[iVar9].p_rc.rate_correction_factors + lVar8 + 0x30) = uVar5
            ;
          }
        }
      }
      return;
    }
    iVar10 = (cpi->rc).avg_frame_bandwidth;
    iVar11 = (cpi->rc).prev_avg_frame_bandwidth >> 1;
    if (iVar11 < iVar10 / 3 || iVar10 < iVar11) {
      (cpi->rc).rc_1_frame = 0;
      (cpi->rc).rc_2_frame = 0;
      iVar3 = (pAVar2->p_rc).optimal_buffer_level;
      (pAVar2->p_rc).bits_off_target = iVar3;
      (pAVar2->p_rc).buffer_level = iVar3;
    }
  }
  return;
}

Assistant:

static inline void check_reset_rc_flag(AV1_COMP *cpi) {
  RATE_CONTROL *rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  if (cpi->common.current_frame.frame_number >
      (unsigned int)cpi->svc.number_spatial_layers) {
    if (cpi->ppi->use_svc) {
      av1_svc_check_reset_layer_rc_flag(cpi);
    } else {
      if (rc->avg_frame_bandwidth / 3 > (rc->prev_avg_frame_bandwidth >> 1) ||
          rc->avg_frame_bandwidth < (rc->prev_avg_frame_bandwidth >> 1)) {
        rc->rc_1_frame = 0;
        rc->rc_2_frame = 0;
        p_rc->bits_off_target = p_rc->optimal_buffer_level;
        p_rc->buffer_level = p_rc->optimal_buffer_level;
      }
    }
  }
}